

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O0

void __thiscall PEFile::_init(PEFile *this,AbstractByteBuffer *v_buf)

{
  int iVar1;
  ResourcesAlbum *this_00;
  DosHdrWrapper *this_01;
  mapped_type *ppEVar2;
  FileHdrWrapper *pFVar3;
  undefined4 extraout_var;
  ExeException *pEVar4;
  RichHdrWrapper *this_02;
  OptHdrWrapper *pOVar5;
  undefined4 extraout_var_00;
  SectHdrsWrapper *pSVar6;
  mapped_type pEVar7;
  DataDirEntryWrapper *pDVar8;
  BoundImpDirWrapper *this_03;
  ExportDirWrapper *this_04;
  LdConfigDirWrapper *this_05;
  RelocDirWrapper *this_06;
  ExceptionDirWrapper *this_07;
  ResourceDirWrapper *this_08;
  key_type local_a8;
  int local_9c;
  key_type kStack_98;
  int i;
  key_type local_90 [2];
  undefined1 local_79;
  QString local_78;
  key_type local_60 [2];
  undefined1 local_49;
  QString local_48;
  key_type local_30 [3];
  AbstractByteBuffer *local_18;
  AbstractByteBuffer *v_buf_local;
  PEFile *this_local;
  
  local_18 = v_buf;
  v_buf_local = (AbstractByteBuffer *)this;
  PECore::wrap(&this->core,v_buf);
  this_00 = (ResourcesAlbum *)operator_new(0xe0);
  ResourcesAlbum::ResourcesAlbum(this_00,(Executable *)this);
  this->album = this_00;
  this_01 = (DosHdrWrapper *)operator_new(0x10);
  DosHdrWrapper::DosHdrWrapper(this_01,(Executable *)this);
  this->dosHdrWrapper = this_01;
  pEVar7 = &this->dosHdrWrapper->super_ExeElementWrapper;
  local_30[0] = 0;
  ppEVar2 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,local_30);
  *ppEVar2 = pEVar7;
  pFVar3 = (FileHdrWrapper *)operator_new(0x20);
  FileHdrWrapper::FileHdrWrapper(pFVar3,this);
  this->fHdr = pFVar3;
  iVar1 = (*(this->fHdr->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_49 = 1;
    pEVar4 = (ExeException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_48,"Cannot parse FileHdr: It is not PE File!");
    ExeException::ExeException(pEVar4,&local_48);
    local_49 = 0;
    __cxa_throw(pEVar4,&ExeException::typeinfo,ExeException::~ExeException);
  }
  pFVar3 = this->fHdr;
  local_60[1] = 2;
  ppEVar2 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,local_60 + 1);
  *ppEVar2 = (mapped_type)pFVar3;
  this_02 = (RichHdrWrapper *)operator_new(0x30);
  RichHdrWrapper::RichHdrWrapper(this_02,this);
  local_60[0] = 1;
  ppEVar2 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,local_60);
  *ppEVar2 = (mapped_type)this_02;
  pOVar5 = (OptHdrWrapper *)operator_new(0x40);
  OptHdrWrapper::OptHdrWrapper(pOVar5,this);
  this->optHdr = pOVar5;
  iVar1 = (*(this->optHdr->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xc])();
  if (CONCAT44(extraout_var_00,iVar1) == 0) {
    local_79 = 1;
    pEVar4 = (ExeException *)__cxa_allocate_exception(0x48);
    QString::QString(&local_78,"Cannot parse OptionalHeader: It is not PE File!");
    ExeException::ExeException(pEVar4,&local_78);
    local_79 = 0;
    __cxa_throw(pEVar4,&ExeException::typeinfo,ExeException::~ExeException);
  }
  pOVar5 = this->optHdr;
  local_90[1] = 3;
  ppEVar2 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,local_90 + 1);
  *ppEVar2 = (mapped_type)pOVar5;
  pSVar6 = (SectHdrsWrapper *)operator_new(0xb0);
  SectHdrsWrapper::SectHdrsWrapper(pSVar6,this);
  this->sects = pSVar6;
  pSVar6 = this->sects;
  local_90[0] = 5;
  ppEVar2 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,local_90);
  *ppEVar2 = (mapped_type)pSVar6;
  pEVar7 = (mapped_type)operator_new(0x18);
  DataDirWrapper::DataDirWrapper((DataDirWrapper *)pEVar7,this);
  kStack_98 = 4;
  ppEVar2 = std::
            map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
            ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,
                         &stack0xffffffffffffff68);
  *ppEVar2 = pEVar7;
  pDVar8 = (DataDirEntryWrapper *)operator_new(0xa8);
  ImportDirWrapper::ImportDirWrapper((ImportDirWrapper *)pDVar8,this);
  this->dataDirEntries[1] = pDVar8;
  pDVar8 = (DataDirEntryWrapper *)operator_new(0xa8);
  DelayImpDirWrapper::DelayImpDirWrapper((DelayImpDirWrapper *)pDVar8,this);
  this->dataDirEntries[0xd] = pDVar8;
  this_03 = (BoundImpDirWrapper *)operator_new(0x58);
  BoundImpDirWrapper::BoundImpDirWrapper(this_03,this);
  this->dataDirEntries[0xb] = (DataDirEntryWrapper *)this_03;
  pDVar8 = (DataDirEntryWrapper *)operator_new(0x50);
  DebugDirWrapper::DebugDirWrapper((DebugDirWrapper *)pDVar8,this);
  this->dataDirEntries[6] = pDVar8;
  this_04 = (ExportDirWrapper *)operator_new(0x80);
  ExportDirWrapper::ExportDirWrapper(this_04,this);
  this->dataDirEntries[0] = (DataDirEntryWrapper *)this_04;
  pDVar8 = (DataDirEntryWrapper *)operator_new(0x50);
  SecurityDirWrapper::SecurityDirWrapper((SecurityDirWrapper *)pDVar8,this);
  this->dataDirEntries[4] = pDVar8;
  pDVar8 = (DataDirEntryWrapper *)operator_new(0x50);
  TlsDirWrapper::TlsDirWrapper((TlsDirWrapper *)pDVar8,this);
  this->dataDirEntries[9] = pDVar8;
  this_05 = (LdConfigDirWrapper *)operator_new(0x80);
  LdConfigDirWrapper::LdConfigDirWrapper(this_05,this);
  this->dataDirEntries[10] = (DataDirEntryWrapper *)this_05;
  this_06 = (RelocDirWrapper *)operator_new(0x58);
  RelocDirWrapper::RelocDirWrapper(this_06,this);
  this->dataDirEntries[5] = (DataDirEntryWrapper *)this_06;
  this_07 = (ExceptionDirWrapper *)operator_new(0x58);
  ExceptionDirWrapper::ExceptionDirWrapper(this_07,this);
  this->dataDirEntries[3] = (DataDirEntryWrapper *)this_07;
  this_08 = (ResourceDirWrapper *)operator_new(0x70);
  ResourceDirWrapper::ResourceDirWrapper(this_08,this,this->album,0,0,-1);
  this->dataDirEntries[2] = (DataDirEntryWrapper *)this_08;
  pDVar8 = (DataDirEntryWrapper *)operator_new(0x50);
  ClrDirWrapper::ClrDirWrapper((ClrDirWrapper *)pDVar8,this);
  this->dataDirEntries[0xe] = pDVar8;
  for (local_9c = 0; local_9c < 0xf; local_9c = local_9c + 1) {
    pDVar8 = this->dataDirEntries[local_9c];
    local_a8 = (long)local_9c + 6;
    ppEVar2 = std::
              map<unsigned_long,_ExeElementWrapper_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ExeElementWrapper_*>_>_>
              ::operator[](&(this->super_MappedExe).super_ExeWrappersContainer.wrappers,&local_a8);
    *ppEVar2 = (mapped_type)pDVar8;
  }
  if (this->album != (ResourcesAlbum *)0x0) {
    ResourcesAlbum::wrapLeafsContent(this->album);
  }
  return;
}

Assistant:

void PEFile::_init(AbstractByteBuffer *v_buf)
{
    // wrap the core:
    core.wrap(v_buf);

    album = new ResourcesAlbum(this);
    
    //generate wrappers:
    this->dosHdrWrapper = new DosHdrWrapper(this);
    this->wrappers[WR_DOS_HDR] = this->dosHdrWrapper;

    this->fHdr = new FileHdrWrapper(this);
    if (fHdr->getPtr() == NULL) throw ExeException("Cannot parse FileHdr: It is not PE File!");
    this->wrappers[WR_FILE_HDR] = fHdr;
    this->wrappers[WR_RICH_HDR] = new RichHdrWrapper(this);

    this->optHdr = new OptHdrWrapper(this);
    if (optHdr->getPtr() == NULL) throw ExeException("Cannot parse OptionalHeader: It is not PE File!");
    this->wrappers[WR_OPTIONAL_HDR] = optHdr;

    this->sects = new SectHdrsWrapper(this);
    this->wrappers[WR_SECTIONS] = sects;

    this->wrappers[WR_DATADIR] = new DataDirWrapper(this);
    dataDirEntries[pe::DIR_IMPORT] = new ImportDirWrapper(this);
    dataDirEntries[pe::DIR_DELAY_IMPORT] = new DelayImpDirWrapper(this);
    dataDirEntries[pe::DIR_BOUND_IMPORT] = new BoundImpDirWrapper(this);
    dataDirEntries[pe::DIR_DEBUG] = new DebugDirWrapper(this);
    dataDirEntries[pe::DIR_EXPORT] = new ExportDirWrapper(this);
    dataDirEntries[pe::DIR_SECURITY] = new SecurityDirWrapper(this);
    dataDirEntries[pe::DIR_TLS] = new TlsDirWrapper(this);
    dataDirEntries[pe::DIR_LOAD_CONFIG] = new LdConfigDirWrapper(this);
    dataDirEntries[pe::DIR_BASERELOC] = new RelocDirWrapper(this);
    dataDirEntries[pe::DIR_EXCEPTION] = new ExceptionDirWrapper(this);
    dataDirEntries[pe::DIR_RESOURCE] = new ResourceDirWrapper(this, album);
    dataDirEntries[pe::DIR_COM_DESCRIPTOR] = new ClrDirWrapper(this); 
 
    for (int i = 0; i < pe::DIR_ENTRIES_COUNT; i++) {
        this->wrappers[WR_DIR_ENTRY + i] = dataDirEntries[i];
    }
    if (this->album) {
        this->album->wrapLeafsContent();
    }
}